

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::Base64UnescapeInternal
              (char *src_param,int szsrc,char *dest,int szdest,char *unbase64)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  uint uVar13;
  byte *pbVar14;
  uint uVar15;
  ulong local_50;
  
  pbVar12 = (byte *)src_param;
  if (dest == (char *)0x0) {
    uVar15 = 0;
    local_50 = 0;
    uVar4 = 0;
    uVar3 = 0;
    while (uVar5 = (uint)uVar4, 3 < szsrc) {
      uVar9 = uVar3;
      if (((((ulong)*pbVar12 == 0) || ((ulong)pbVar12[1] == 0)) || ((ulong)pbVar12[2] == 0)) ||
         (uVar9 = (int)unbase64[pbVar12[3]] |
                  (int)unbase64[pbVar12[2]] << 6 |
                  (int)unbase64[pbVar12[1]] << 0xc | (int)unbase64[*pbVar12] << 0x12, (int)uVar9 < 0
         )) {
        pbVar6 = pbVar12 + 2;
        src_param = (char *)(ulong)(szsrc - 1);
        pbVar14 = pbVar12 + 3;
        iVar10 = szsrc - 2;
        pbVar11 = pbVar12 + 4;
        pbVar2 = pbVar12;
        uVar5 = szsrc + 1;
        while( true ) {
          uVar13 = uVar5;
          pbVar12 = pbVar2 + 1;
          bVar1 = *pbVar2;
          uVar15 = (uint)unbase64[bVar1];
          uVar3 = uVar9;
          if (-1 < unbase64[bVar1]) break;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_0017295a;
          szsrc = szsrc - 1;
          pbVar6 = pbVar6 + 1;
          src_param = (char *)(ulong)((int)src_param - 1);
          pbVar14 = pbVar14 + 1;
          iVar10 = iVar10 + -1;
          pbVar11 = pbVar11 + 1;
          pbVar2 = pbVar12;
          uVar5 = uVar13 - 1;
          if (uVar13 - 1 < 5) goto LAB_0017295a;
        }
        while( true ) {
          uVar13 = szsrc;
          pbVar12 = pbVar6;
          bVar1 = pbVar12[-1];
          uVar15 = (uint)unbase64[bVar1];
          if (-1 < unbase64[bVar1]) break;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_0017297c;
          src_param = (char *)(ulong)((int)src_param - 1);
          pbVar14 = pbVar14 + 1;
          iVar10 = iVar10 + -1;
          pbVar11 = pbVar11 + 1;
          pbVar6 = pbVar12 + 1;
          szsrc = uVar13 - 1;
          if ((int)(uVar13 - 1) < 4) goto LAB_0017297c;
        }
        while( true ) {
          pbVar12 = pbVar14;
          uVar5 = (uint)pbVar12[-1];
          uVar15 = (uint)unbase64[uVar5];
          if (-1 < unbase64[uVar5]) break;
          uVar9 = (uint)src_param;
          if ((0x20 < uVar5) || ((0x100003e00U >> ((ulong)uVar5 & 0x3f) & 1) == 0))
          goto LAB_0017296a;
          src_param = (char *)(ulong)(uVar9 - 1);
          iVar10 = iVar10 + -1;
          pbVar11 = pbVar11 + 1;
          pbVar14 = pbVar12 + 1;
          if ((int)(uVar9 - 1) < 3) goto LAB_0017296a;
        }
        while( true ) {
          iVar7 = iVar10;
          pbVar12 = pbVar11;
          bVar1 = pbVar12[-1];
          uVar4 = (ulong)bVar1;
          uVar5 = (uint)bVar1;
          uVar15 = (uint)unbase64[uVar4];
          if (-1 < unbase64[uVar4]) break;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_00172ae6;
          pbVar11 = pbVar12 + 1;
          iVar10 = iVar7 + -1;
          if (iVar7 + -1 < 2) goto LAB_00172ae6;
        }
        szsrc = iVar7 - 2;
      }
      else {
        szsrc = szsrc - 4;
        pbVar12 = pbVar12 + 4;
        uVar4 = 0;
        uVar15 = 0xffffffff;
        src_param = unbase64;
        uVar3 = uVar9;
      }
      local_50 = (ulong)((int)local_50 + 3);
    }
    uVar13 = 0;
  }
  else {
    uVar15 = 0;
    uVar4 = 0;
    local_50 = 0;
    uVar3 = 0;
    while (uVar5 = (uint)uVar4, 3 < szsrc) {
      if (((((ulong)*pbVar12 == 0) || ((ulong)pbVar12[1] == 0)) || ((ulong)pbVar12[2] == 0)) ||
         (uVar3 = (int)unbase64[pbVar12[3]] |
                  (int)unbase64[pbVar12[2]] << 6 |
                  (int)unbase64[pbVar12[1]] << 0xc | (int)unbase64[*pbVar12] << 0x12, (int)uVar3 < 0
         )) {
        pbVar6 = pbVar12 + 2;
        pbVar14 = pbVar12 + 3;
        iVar10 = szsrc - 2;
        src_param = (char *)(pbVar12 + 4);
        pbVar2 = pbVar12;
        uVar5 = szsrc + 1;
        uVar8 = szsrc;
        while( true ) {
          uVar13 = uVar5;
          uVar8 = uVar8 - 1;
          pbVar12 = pbVar2 + 1;
          bVar1 = *pbVar2;
          uVar9 = (uint)unbase64[bVar1];
          if (-1 < (int)uVar9) break;
          uVar15 = uVar9;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_0017295a;
          szsrc = szsrc - 1;
          pbVar6 = pbVar6 + 1;
          pbVar14 = pbVar14 + 1;
          iVar10 = iVar10 + -1;
          src_param = (char *)((byte *)src_param + 1);
          pbVar2 = pbVar12;
          uVar5 = uVar13 - 1;
          if (uVar13 - 1 < 5) goto LAB_0017295a;
        }
        while( true ) {
          uVar13 = szsrc;
          pbVar12 = pbVar6;
          bVar1 = pbVar12[-1];
          uVar15 = (uint)unbase64[bVar1];
          if (-1 < unbase64[bVar1]) break;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_0017297c;
          uVar8 = uVar8 - 1;
          pbVar14 = pbVar14 + 1;
          iVar10 = iVar10 + -1;
          src_param = (char *)((byte *)src_param + 1);
          pbVar6 = pbVar12 + 1;
          szsrc = uVar13 - 1;
          if ((int)(uVar13 - 1) < 4) goto LAB_0017297c;
        }
        uVar3 = uVar9 << 6 | uVar15;
        while( true ) {
          uVar9 = uVar8;
          pbVar12 = pbVar14;
          bVar1 = pbVar12[-1];
          uVar5 = (uint)bVar1;
          uVar15 = (uint)unbase64[bVar1];
          if (-1 < unbase64[bVar1]) break;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_0017296a;
          iVar10 = iVar10 + -1;
          src_param = (char *)((byte *)src_param + 1);
          pbVar14 = pbVar12 + 1;
          uVar8 = uVar9 - 1;
          if ((int)(uVar9 - 1) < 3) goto LAB_0017296a;
        }
        uVar3 = uVar3 << 6 | uVar15;
        while( true ) {
          iVar7 = iVar10;
          pbVar12 = (byte *)src_param;
          bVar1 = pbVar12[-1];
          uVar4 = (ulong)bVar1;
          uVar5 = (uint)bVar1;
          uVar15 = (uint)unbase64[uVar4];
          if (-1 < unbase64[uVar4]) break;
          src_param = (char *)pbVar12;
          if ((0x20 < bVar1) || ((0x100003e00U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
          goto LAB_00172ae6;
          src_param = (char *)(pbVar12 + 1);
          iVar10 = iVar7 + -1;
          if (iVar7 + -1 < 2) goto LAB_00172ae6;
        }
        uVar3 = uVar3 << 6 | uVar15;
        szsrc = iVar7 - 2;
      }
      else {
        szsrc = szsrc - 4;
        pbVar12 = pbVar12 + 4;
        uVar4 = 0;
        uVar15 = 0xffffffff;
      }
      if (szdest < (int)(local_50 + 3)) {
        return -1;
      }
      *(ushort *)(dest + local_50 + 1) = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
      dest[local_50] = (char)(uVar3 >> 0x10);
      src_param = dest;
      local_50 = local_50 + 3;
      uVar3 = uVar3 >> 0x10;
    }
    uVar13 = 0;
  }
LAB_00172982:
  uVar9 = szsrc;
  if ((int)uVar15 < 0) {
    if ((uVar5 == 0x3d) || (uVar5 == 0x2e)) goto LAB_00172a60;
    if (uVar5 == 0) goto LAB_001729d6;
    if (0x20 < (byte)uVar5) {
      return -1;
    }
    if ((0x100003e00U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      return -1;
    }
  }
  if ((uVar5 != 0x3d) && (uVar5 != 0x2e)) {
LAB_001729d6:
    while( true ) {
      while( true ) {
        uVar15 = uVar9;
        pbVar6 = pbVar12;
        if ((int)uVar15 < 1) {
          iVar10 = (*(code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]))
                             (&DAT_0017bd1c,szsrc >> 0x1f & szsrc,uVar3,
                              (code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]),
                              uVar3);
          return iVar10;
        }
        bVar1 = *pbVar6;
        if (unbase64[bVar1] < '\0') break;
        uVar5 = uVar3 << 6;
        uVar8 = (int)unbase64[bVar1] | uVar5;
        uVar13 = uVar13 + 1;
        szsrc = uVar15 - 1;
        pbVar12 = pbVar6 + 1;
        uVar9 = szsrc;
        uVar3 = uVar8;
        if (uVar13 == 4) {
          iVar10 = (int)local_50;
          local_50 = (ulong)(iVar10 + 3U);
          szsrc = uVar15 - 1;
          uVar13 = 0;
          uVar3 = 0;
          pbVar12 = pbVar6 + 1;
          uVar9 = szsrc;
          if (dest != (char *)0x0) {
            if (szdest < (int)(iVar10 + 3U)) {
              return -1;
            }
            dest[(long)iVar10 + 2] = (char)uVar8;
            dest[(long)iVar10 + 1] = (char)(uVar5 >> 8);
            dest[iVar10] = (char)(uVar5 >> 0x10);
            uVar3 = 0;
          }
        }
      }
      if (0x3d < bVar1) {
        return -1;
      }
      uVar4 = (ulong)(uint)bVar1;
      if ((0x100003e00U >> (uVar4 & 0x3f) & 1) == 0) break;
      pbVar12 = pbVar6 + 1;
      uVar9 = uVar15 - 1;
    }
    if ((0x2000400000000000U >> (uVar4 & 0x3f) & 1) != 0) {
      iVar10 = (*(code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]))();
      return iVar10;
    }
    if (uVar4 != 0) {
      return -1;
    }
    iVar10 = (*(code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]))
                       (&DAT_0017bd1c,uVar15 - 1,uVar3,
                        (code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]),uVar3);
    return iVar10;
  }
LAB_00172a60:
  iVar10 = (*(code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]))
                     (src_param,szsrc + 1,&DAT_0017bd1c,
                      (code *)((long)&DAT_0017bd1c + (long)(int)(&DAT_0017bd1c)[uVar13]),uVar3,
                      local_50 & 0xffffffff);
  return iVar10;
LAB_00172ae6:
  uVar13 = 3;
  szsrc = iVar7 - 2;
  goto LAB_00172982;
LAB_0017296a:
  szsrc = uVar9 - 2;
  uVar13 = 2;
  goto LAB_00172982;
LAB_0017297c:
  uVar5 = (uint)bVar1;
  szsrc = uVar13 - 2;
  uVar13 = 1;
  uVar3 = uVar9;
  goto LAB_00172982;
LAB_0017295a:
  uVar5 = (uint)bVar1;
  szsrc = uVar13 - 2;
  uVar13 = 0;
  goto LAB_00172982;
}

Assistant:

int Base64UnescapeInternal(const char *src_param, int szsrc,
                           char *dest, int szdest,
                           const signed char* unbase64) {
  static const char kPad64Equals = '=';
  static const char kPad64Dot = '.';

  int decode = 0;
  int destidx = 0;
  int state = 0;
  unsigned int ch = 0;
  unsigned int temp = 0;

  // If "char" is signed by default, using *src as an array index results in
  // accessing negative array elements. Treat the input as a pointer to
  // unsigned char to avoid this.
  const unsigned char *src = reinterpret_cast<const unsigned char*>(src_param);

  // The GET_INPUT macro gets the next input character, skipping
  // over any whitespace, and stopping when we reach the end of the
  // string or when we read any non-data character.  The arguments are
  // an arbitrary identifier (used as a label for goto) and the number
  // of data bytes that must remain in the input to avoid aborting the
  // loop.
#define GET_INPUT(label, remain)                 \
  label:                                         \
    --szsrc;                                     \
    ch = *src++;                                 \
    decode = unbase64[ch];                       \
    if (decode < 0) {                            \
      if (ascii_isspace(ch) && szsrc >= remain)  \
        goto label;                              \
      state = 4 - remain;                        \
      break;                                     \
    }

  // if dest is null, we're just checking to see if it's legal input
  // rather than producing output.  (I suspect this could just be done
  // with a regexp...).  We duplicate the loop so this test can be
  // outside it instead of in every iteration.

  if (dest) {
    // This loop consumes 4 input bytes and produces 3 output bytes
    // per iteration.  We can't know at the start that there is enough
    // data left in the string for a full iteration, so the loop may
    // break out in the middle; if so 'state' will be set to the
    // number of input bytes read.

    while (szsrc >= 4)  {
      // We'll start by optimistically assuming that the next four
      // bytes of the string (src[0..3]) are four good data bytes
      // (that is, no nulls, whitespace, padding chars, or illegal
      // chars).  We need to test src[0..2] for nulls individually
      // before constructing temp to preserve the property that we
      // never read past a null in the string (no matter how long
      // szsrc claims the string is).

      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        // Iff any of those four characters was bad (null, illegal,
        // whitespace, padding), then temp's high bit will be set
        // (because unbase64[] is -1 for all bad characters).
        //
        // We'll back up and resort to the slower decoder, which knows
        // how to handle those cases.

        GET_INPUT(first, 4);
        temp = decode;
        GET_INPUT(second, 3);
        temp = (temp << 6) | decode;
        GET_INPUT(third, 2);
        temp = (temp << 6) | decode;
        GET_INPUT(fourth, 1);
        temp = (temp << 6) | decode;
      } else {
        // We really did have four good data bytes, so advance four
        // characters in the string.

        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }

      // temp has 24 bits of input, so write that out as three bytes.

      if (destidx+3 > szdest) return -1;
      dest[destidx+2] = temp;
      temp >>= 8;
      dest[destidx+1] = temp;
      temp >>= 8;
      dest[destidx] = temp;
      destidx += 3;
    }
  } else {
    while (szsrc >= 4)  {
      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        GET_INPUT(first_no_dest, 4);
        GET_INPUT(second_no_dest, 3);
        GET_INPUT(third_no_dest, 2);
        GET_INPUT(fourth_no_dest, 1);
      } else {
        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }
      destidx += 3;
    }
  }

#undef GET_INPUT

  // if the loop terminated because we read a bad character, return
  // now.
  if (decode < 0 && ch != '\0' &&
      ch != kPad64Equals && ch != kPad64Dot && !ascii_isspace(ch))
    return -1;

  if (ch == kPad64Equals || ch == kPad64Dot) {
    // if we stopped by hitting an '=' or '.', un-read that character -- we'll
    // look at it again when we count to check for the proper number of
    // equals signs at the end.
    ++szsrc;
    --src;
  } else {
    // This loop consumes 1 input byte per iteration.  It's used to
    // clean up the 0-3 input bytes remaining when the first, faster
    // loop finishes.  'temp' contains the data from 'state' input
    // characters read by the first loop.
    while (szsrc > 0)  {
      --szsrc;
      ch = *src++;
      decode = unbase64[ch];
      if (decode < 0) {
        if (ascii_isspace(ch)) {
          continue;
        } else if (ch == '\0') {
          break;
        } else if (ch == kPad64Equals || ch == kPad64Dot) {
          // back up one character; we'll read it again when we check
          // for the correct number of pad characters at the end.
          ++szsrc;
          --src;
          break;
        } else {
          return -1;
        }
      }

      // Each input character gives us six bits of output.
      temp = (temp << 6) | decode;
      ++state;
      if (state == 4) {
        // If we've accumulated 24 bits of output, write that out as
        // three bytes.
        if (dest) {
          if (destidx+3 > szdest) return -1;
          dest[destidx+2] = temp;
          temp >>= 8;
          dest[destidx+1] = temp;
          temp >>= 8;
          dest[destidx] = temp;
        }
        destidx += 3;
        state = 0;
        temp = 0;
      }
    }
  }

  // Process the leftover data contained in 'temp' at the end of the input.
  int expected_equals = 0;
  switch (state) {
    case 0:
      // Nothing left over; output is a multiple of 3 bytes.
      break;

    case 1:
      // Bad input; we have 6 bits left over.
      return -1;

    case 2:
      // Produce one more output byte from the 12 input bits we have left.
      if (dest) {
        if (destidx+1 > szdest) return -1;
        temp >>= 4;
        dest[destidx] = temp;
      }
      ++destidx;
      expected_equals = 2;
      break;

    case 3:
      // Produce two more output bytes from the 18 input bits we have left.
      if (dest) {
        if (destidx+2 > szdest) return -1;
        temp >>= 2;
        dest[destidx+1] = temp;
        temp >>= 8;
        dest[destidx] = temp;
      }
      destidx += 2;
      expected_equals = 1;
      break;

    default:
      // state should have no other values at this point.
      GOOGLE_LOG(FATAL) << "This can't happen; base64 decoder state = " << state;
  }

  // The remainder of the string should be all whitespace, mixed with
  // exactly 0 equals signs, or exactly 'expected_equals' equals
  // signs.  (Always accepting 0 equals signs is a google extension
  // not covered in the RFC, as is accepting dot as the pad character.)

  int equals = 0;
  while (szsrc > 0 && *src) {
    if (*src == kPad64Equals || *src == kPad64Dot)
      ++equals;
    else if (!ascii_isspace(*src))
      return -1;
    --szsrc;
    ++src;
  }

  return (equals == 0 || equals == expected_equals) ? destidx : -1;
}